

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O1

void __thiscall libtorrent::tracker_error_alert::~tracker_error_alert(tracker_error_alert *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  
  (this->super_tracker_alert).super_torrent_alert.super_alert._vptr_alert =
       (_func_int **)&PTR__torrent_alert_004ebb90;
  p_Var2 = (this->super_tracker_alert).super_torrent_alert.handle.m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
    }
  }
  operator_delete(this,0x70);
  return;
}

Assistant:

struct TORRENT_EXPORT tracker_error_alert final : tracker_alert
	{
		// internal
		TORRENT_UNEXPORT tracker_error_alert(aux::stack_allocator& alloc
			, torrent_handle const& h, tcp::endpoint const& ep
			, int times, protocol_version v, string_view u
			, operation_t op, error_code const& e, string_view m);

		TORRENT_DEFINE_ALERT_PRIO(tracker_error_alert, 11, alert_priority::high)

		static inline constexpr alert_category_t static_category = alert_category::tracker | alert_category::error;
		std::string message() const override;

		// This member says how many times in a row this tracker has failed.
		int const times_in_row;

		// the error code indicating why the tracker announce failed. If it is
		// is ``lt::errors::tracker_failure`` the failure_reason() might contain
		// a more detailed description of why the tracker rejected the request.
		// HTTP status codes indicating errors are also set in this field.
		error_code const error;

		operation_t op;

		// if the tracker sent a "failure reason" string, it will be returned
		// here.
		char const* failure_reason() const;

		// hidden
		char const* error_message() const { return failure_reason(); }

	private:
		aux::allocation_slot m_msg_idx;
#if TORRENT_ABI_VERSION == 1
	public:
		TORRENT_DEPRECATED int const status_code;
		TORRENT_DEPRECATED std::string msg;
#endif
	}